

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListModeViewBase::updateHorizontalScrollBar(QListModeViewBase *this,QSize *step)

{
  bool bVar1;
  ScrollMode SVar2;
  Flow FVar3;
  int min;
  int iVar4;
  int iVar5;
  int max;
  qsizetype qVar6;
  QCommonListViewBase *in_RDI;
  QSize *in_stack_00000008;
  QCommonListViewBase *in_stack_00000010;
  bool in_stack_0000001f;
  int pageSteps;
  int steps;
  int in_stack_00000068;
  int in_stack_0000006c;
  int in_stack_ffffffffffffffcc;
  QSize *local_28;
  int in_stack_ffffffffffffffe8;
  
  SVar2 = QCommonListViewBase::horizontalScrollMode((QCommonListViewBase *)0x881991);
  if ((SVar2 != ScrollPerItem) ||
     (((FVar3 = QCommonListViewBase::flow(in_RDI), FVar3 != TopToBottom ||
       (bVar1 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x8819b3), !bVar1)) &&
      ((FVar3 = QCommonListViewBase::flow(in_RDI), FVar3 != LeftToRight ||
       (bVar1 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x8819d4), bVar1)))))) {
    QCommonListViewBase::updateHorizontalScrollBar(in_stack_00000010,in_stack_00000008);
  }
  else {
    FVar3 = QCommonListViewBase::flow(in_RDI);
    if (FVar3 == TopToBottom) {
      local_28 = &in_RDI[1].contentsSize;
    }
    else {
      local_28 = (QSize *)&in_RDI[3].qq;
    }
    qVar6 = QList<int>::size((QList<int> *)local_28);
    min = (int)qVar6 + -1;
    if (min < 1) {
      QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x881acb);
      QAbstractSlider::setRange((QAbstractSlider *)in_RDI,min,in_stack_ffffffffffffffe8);
    }
    else {
      QCommonListViewBase::viewport(in_RDI);
      iVar4 = QWidget::width((QWidget *)0x881a3a);
      iVar5 = QSize::width((QSize *)0x881a4c);
      QCommonListViewBase::isWrapping((QCommonListViewBase *)0x881a5a);
      max = perItemScrollingPageSteps
                      (_pageSteps,in_stack_0000006c,in_stack_00000068,in_stack_0000001f);
      QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x881a80);
      QAbstractSlider::setSingleStep
                ((QAbstractSlider *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffcc);
      QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x881a97);
      QAbstractSlider::setPageStep
                ((QAbstractSlider *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffcc);
      QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x881aad);
      QAbstractSlider::setRange((QAbstractSlider *)in_RDI,min,max);
    }
  }
  return;
}

Assistant:

void QListModeViewBase::updateHorizontalScrollBar(const QSize &step)
{
    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem
        && ((flow() == QListView::TopToBottom && isWrapping())
        || (flow() == QListView::LeftToRight && !isWrapping()))) {
            int steps = (flow() == QListView::TopToBottom ? segmentPositions : scrollValueMap).size() - 1;
            if (steps > 0) {
                const int pageSteps = perItemScrollingPageSteps(viewport()->width(), contentsSize.width(), isWrapping());
                horizontalScrollBar()->setSingleStep(1);
                horizontalScrollBar()->setPageStep(pageSteps);
                horizontalScrollBar()->setRange(0, steps - pageSteps);
            } else {
                horizontalScrollBar()->setRange(0, 0);
            }
    } else {
        QCommonListViewBase::updateHorizontalScrollBar(step);
    }
}